

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O0

bool CEditor::PopupLayer(void *pContext,CUIRect View)

{
  bool bVar1;
  int iVar2;
  CLayer *pIDs;
  CLayerGroup **ppCVar3;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  byte bVar4;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int Prop;
  CLayerGroup *pCurrentGroup;
  bool IsGameLayer;
  CEditor *pEditor;
  int NewVal;
  CUIRect Button;
  CLayer *pCurrentLayer;
  CProperty aProps [4];
  char *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int iVar5;
  float in_stack_ffffffffffffff34;
  CEditor *in_stack_ffffffffffffff38;
  CLayerGroup *this;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  CUIRect *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  bool local_95;
  int *in_stack_ffffffffffffff78;
  CProperty *pProps;
  CUIRect *pToolBox;
  char *this_00;
  undefined1 auStack_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pProps = (CProperty *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  pToolBox = (CUIRect *)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  pIDs = GetSelectedLayer(in_stack_ffffffffffffff38,(int)in_stack_ffffffffffffff34);
  bVar4 = (CLayer *)(in_RDI->m_Map).m_pGameLayer == pIDs;
  CUIRect::HSplitBottom
            ((CUIRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff24,(CUIRect *)in_stack_ffffffffffffff18,(CUIRect *)0x21282c);
  if ((bVar4 & 1) == 0) {
    in_stack_ffffffffffffff18 = "Deletes the layer";
    iVar2 = DoButton_Editor(in_RDI,(void *)CONCAT17(bVar4,in_stack_ffffffffffffff50),
                            (char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                            (CUIRect *)in_stack_ffffffffffffff38,(int)in_stack_ffffffffffffff34,
                            (char *)pIDs);
    if (iVar2 != 0) {
      array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                (&(in_RDI->m_Map).m_lGroups,in_RDI->m_SelectedGroup);
      CLayerGroup::DeleteLayer
                ((CLayerGroup *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff2c);
      local_95 = true;
      goto LAB_00212cd9;
    }
  }
  if ((bVar4 & 1) == 0) {
    CUIRect::HSplitBottom
              ((CUIRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff24,(CUIRect *)in_stack_ffffffffffffff18,(CUIRect *)0x2128c8);
    CUIRect::HSplitBottom
              ((CUIRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff24,(CUIRect *)in_stack_ffffffffffffff18,(CUIRect *)0x2128e2);
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(bVar4,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48,
                 (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (float)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff34,SUB41((uint)in_stack_ffffffffffffff30 >> 0x18,0));
    CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                        in_stack_ffffffffffffff24,(CUIRect *)in_stack_ffffffffffffff18,
                        (CUIRect *)0x212931);
    if ((PopupLayer(void*,CUIRect)::s_NameInput == '\0') &&
       (iVar2 = __cxa_guard_acquire(&PopupLayer(void*,CUIRect)::s_NameInput), iVar2 != 0)) {
      CLineInput::CLineInput
                ((CLineInput *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      __cxa_atexit(CLineInput::~CLineInput,&PopupLayer::s_NameInput,&__dso_handle);
      __cxa_guard_release(&PopupLayer(void*,CUIRect)::s_NameInput);
    }
    CLineInput::SetBuffer
              ((CLineInput *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,0);
    bVar1 = DoEditBox((CEditor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (CLineInput *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      (float)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    if (bVar1) {
      (in_RDI->m_Map).m_Modified = true;
    }
  }
  CUIRect::HSplitBottom
            ((CUIRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff24,(CUIRect *)in_stack_ffffffffffffff18,(CUIRect *)0x212a09);
  ppCVar3 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                      (&(in_RDI->m_Map).m_lGroups,in_RDI->m_SelectedGroup);
  this = *ppCVar3;
  this_00 = "Group";
  array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::size(&(in_RDI->m_Map).m_lGroups);
  array<CLayer_*,_allocator_default<CLayer_*>_>::size(&this->m_lLayers);
  memset(auStack_20,0,0x18);
  iVar2 = DoProperties((CEditor *)this_00,pToolBox,pProps,(int *)pIDs,in_stack_ffffffffffffff78);
  if (iVar2 != -1) {
    (in_RDI->m_Map).m_Modified = true;
  }
  if (iVar2 == 1) {
    iVar2 = CLayerGroup::SwapLayers(this,1,in_stack_ffffffffffffff30);
    in_RDI->m_SelectedLayer = iVar2;
  }
  else if ((iVar2 == 0) && ((bVar4 & 1) == 0)) {
    iVar5 = 0;
    iVar2 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::size
                      (&(in_RDI->m_Map).m_lGroups);
    if (iVar5 < iVar2) {
      array<CLayer_*,_allocator_default<CLayer_*>_>::remove
                (&this->m_lLayers,&stack0xffffffffffffff80);
      array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                (&(in_RDI->m_Map).m_lGroups,0);
      array<CLayer_*,_allocator_default<CLayer_*>_>::add
                ((array<CLayer_*,_allocator_default<CLayer_*>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (CLayer **)in_stack_ffffffffffffff18);
      in_RDI->m_SelectedGroup = 0;
      ppCVar3 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                          (&(in_RDI->m_Map).m_lGroups,0);
      iVar2 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&(*ppCVar3)->m_lLayers);
      in_RDI->m_SelectedLayer = iVar2 + -1;
    }
  }
  else if (iVar2 == 2) {
    pIDs->m_Flags = pIDs->m_Flags & 0xfffffffe;
  }
  iVar2 = (*pIDs->_vptr_CLayer[0xb])(pIDs,&stack0xffffffffffffff88);
  local_95 = iVar2 != 0;
LAB_00212cd9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_95;
}

Assistant:

bool CEditor::PopupLayer(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CLayer *pCurrentLayer = pEditor->GetSelectedLayer(0);
	bool IsGameLayer = pEditor->m_Map.m_pGameLayer == pCurrentLayer;

	// remove layer button
	CUIRect Button;
	View.HSplitBottom(12.0f, &View, &Button);
	static int s_DeleteButton = 0;

	// don't allow deletion of game layer
	if(!IsGameLayer && pEditor->DoButton_Editor(&s_DeleteButton, "Delete layer", 0, &Button, 0, "Deletes the layer"))
	{
		pEditor->m_Map.m_lGroups[pEditor->m_SelectedGroup]->DeleteLayer(pEditor->m_SelectedLayer);
		return true;
	}

	// layer name
	if(!IsGameLayer)
	{
		View.HSplitBottom(5.0f, &View, &Button);
		View.HSplitBottom(16.0f, &View, &Button);
		pEditor->UI()->DoLabel(&Button, "Name:", 10.0f, TEXTALIGN_LEFT);
		Button.VSplitLeft(40.0f, 0, &Button);
		static CLineInput s_NameInput;
		s_NameInput.SetBuffer(pCurrentLayer->m_aName, sizeof(pCurrentLayer->m_aName));
		if(pEditor->DoEditBox(&s_NameInput, &Button, 10.0f))
			pEditor->m_Map.m_Modified = true;
	}

	View.HSplitBottom(10.0f, &View, 0);

	CLayerGroup *pCurrentGroup = pEditor->m_Map.m_lGroups[pEditor->m_SelectedGroup];

	enum
	{
		PROP_GROUP=0,
		PROP_ORDER,
		PROP_HQ,
		NUM_PROPS,
	};

	CProperty aProps[] = {
		{"Group", pEditor->m_SelectedGroup, PROPTYPE_INT_STEP, 0, pEditor->m_Map.m_lGroups.size()-1},
		{"Order", pEditor->m_SelectedLayer, PROPTYPE_INT_STEP, 0, pCurrentGroup->m_lLayers.size()},
		{"Detail", pCurrentLayer->m_Flags&LAYERFLAG_DETAIL, PROPTYPE_BOOL, 0, 1},
		{0},
	};

	if(IsGameLayer) // dont use Group and Detail from the selection if this is the game layer
	{
		aProps[0].m_Type = PROPTYPE_NULL;
		aProps[2].m_Type = PROPTYPE_NULL;
	}

	static int s_aIds[NUM_PROPS] = {0};
	int NewVal = 0;
	int Prop = pEditor->DoProperties(&View, aProps, s_aIds, &NewVal);
	if(Prop != -1)
		pEditor->m_Map.m_Modified = true;

	if(Prop == PROP_ORDER)
		pEditor->m_SelectedLayer = pCurrentGroup->SwapLayers(pEditor->m_SelectedLayer, NewVal);
	else if(Prop == PROP_GROUP && !IsGameLayer)
	{
		if(NewVal >= 0 && NewVal < pEditor->m_Map.m_lGroups.size())
		{
			pCurrentGroup->m_lLayers.remove(pCurrentLayer);
			pEditor->m_Map.m_lGroups[NewVal]->m_lLayers.add(pCurrentLayer);
			pEditor->m_SelectedGroup = NewVal;
			pEditor->m_SelectedLayer = pEditor->m_Map.m_lGroups[NewVal]->m_lLayers.size()-1;
		}
	}
	else if(Prop == PROP_HQ)
	{
		pCurrentLayer->m_Flags &= ~LAYERFLAG_DETAIL;
		if(NewVal)
			pCurrentLayer->m_Flags |= LAYERFLAG_DETAIL;
	}

	return pCurrentLayer->RenderProperties(&View);
}